

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

upb_Message * upb_Message_New(upb_MiniTable *m,upb_Arena *a)

{
  ushort uVar1;
  void *__s;
  upb_Message *puVar2;
  
  uVar1 = m->size_dont_copy_me__upb_internal_use_only;
  __s = upb_Arena_Malloc(a,(ulong)uVar1);
  if (__s != (void *)0x0) {
    puVar2 = (upb_Message *)memset(__s,0,(ulong)uVar1);
    return puVar2;
  }
  return (upb_Message *)0x0;
}

Assistant:

UPB_INLINE struct upb_Message* _upb_Message_New(const upb_MiniTable* m,
                                                upb_Arena* a) {
#ifdef UPB_TRACING_ENABLED
  upb_Message_LogNewMessage(m, a);
#endif  // UPB_TRACING_ENABLED

  const int size = m->UPB_PRIVATE(size);
  struct upb_Message* msg = (struct upb_Message*)upb_Arena_Malloc(a, size);
  if (UPB_UNLIKELY(!msg)) return NULL;
  memset(msg, 0, size);
  return msg;
}